

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_factory.hpp
# Opt level: O2

AngularQuad IntegratorXX::angular_from_string(string *name)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  runtime_error *this;
  AngularQuad AVar5;
  size_type sVar6;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  sVar2 = name->_M_string_length;
  for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
    iVar4 = toupper((int)pcVar1[sVar6]);
    pcVar1[sVar6] = (char)iVar4;
  }
  bVar3 = std::operator==(name,"AHRENSBEYLKIN");
  AVar5 = AhrensBeylkin;
  if (!bVar3) {
    bVar3 = std::operator==(name,"AB");
    if (!bVar3) {
      bVar3 = std::operator==(name,"DELLEY");
      AVar5 = Delley;
      if (!bVar3) {
        bVar3 = std::operator==(name,"LEBEDEVLAIKOV");
        AVar5 = LebedevLaikov;
        if (!bVar3) {
          bVar3 = std::operator==(name,"LEBEDEV");
          if (!bVar3) {
            bVar3 = std::operator==(name,"LL");
            if (!bVar3) {
              bVar3 = std::operator==(name,"WOMERSLEY");
              AVar5 = Womersley;
              if (!bVar3) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"Unrecognized Angular Quadrature");
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
            }
          }
        }
      }
    }
  }
  return AVar5;
}

Assistant:

AngularQuad angular_from_string(std::string name) {
  std::transform(name.begin(), name.end(), name.begin(), ::toupper);
  if(name == "AHRENSBEYLKIN") return AngularQuad::AhrensBeylkin;
  if(name == "AB")            return AngularQuad::AhrensBeylkin;
  if(name == "DELLEY")        return AngularQuad::Delley;
  if(name == "LEBEDEVLAIKOV") return AngularQuad::LebedevLaikov;
  if(name == "LEBEDEV")       return AngularQuad::LebedevLaikov;
  if(name == "LL")            return AngularQuad::LebedevLaikov;
  if(name == "WOMERSLEY")     return AngularQuad::Womersley;

  throw std::runtime_error("Unrecognized Angular Quadrature");
}